

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O3

void __thiscall
AppParametersTest_precedent_Test::~AppParametersTest_precedent_Test
          (AppParametersTest_precedent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AppParametersTest, precedent) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe", L"some", L"words", L"--switch", L"-key", L"value", L"--", L"-other_key", L"value" };
	ArgWrapper<wchar_t> envs{ L"key=other_value", L"other_key=some_value" };
	app_parameters parameters{ args.argc(), args.argv(), envs.argv() };

	EXPECT_EQ(parameters.precedent(), u8"some words");
	EXPECT_TRUE(parameters.has_switch(u8"switch"));
	EXPECT_EQ(parameters.get_arg_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_env_value(u8"key"), u8"other_value");
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_value(u8"other_key"), u8"some_value");
}